

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,string *filename,bool noPolicyScope)

{
  string_view value;
  bool bVar1;
  string *psVar2;
  char *filename_00;
  cmMessenger *messenger;
  undefined1 local_e8 [8];
  cmListFile listFile;
  IncludeScope incScope;
  string filenametoread;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue def;
  bool noPolicyScope_local;
  string *filename_local;
  cmMakefile *this_local;
  
  def.Value._7_1_ = noPolicyScope;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_CURRENT_LIST_FILE",&local_51);
  local_30 = GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CMAKE_PARENT_LIST_FILE",&local_89);
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    AddDefinition(this,&local_88,value);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  psVar2 = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&incScope.NoPolicyScope,filename,psVar2);
  IncludeScope::IncludeScope
            ((IncludeScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(string *)&incScope.NoPolicyScope,
             (bool)(def.Value._7_1_ & 1));
  cmListFile::cmListFile((cmListFile *)local_e8);
  filename_00 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_e8,filename_00,messenger,&this->Backtrace);
  if (bVar1) {
    RunListFile(this,(cmListFile *)local_e8,(string *)&incScope.NoPolicyScope,(DeferCommands *)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      IncludeScope::Quiet((IncludeScope *)
                          &listFile.Functions.
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmListFile::~cmListFile((cmListFile *)local_e8);
  IncludeScope::~IncludeScope
            ((IncludeScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&incScope.NoPolicyScope);
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ReadDependentFile(const std::string& filename,
                                   bool noPolicyScope)
{
  if (cmValue def = this->GetDefinition("CMAKE_CURRENT_LIST_FILE")) {
    this->AddDefinition("CMAKE_PARENT_LIST_FILE", *def);
  }
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    incScope.Quiet();
  }
  return true;
}